

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O1

void target_release(void)

{
  _Bool _Var1;
  monster *mon;
  
  target_fixed = 0;
  if ((old_target.midx != 0) &&
     (((mon = cave_monster(cave,old_target.midx), mon == (monster *)0x0 ||
       (mon->race == (monster_race *)0x0)) || (_Var1 = monster_is_in_view(mon), !_Var1)))) {
    target.grid.x = 0;
    target.grid.y = 0;
  }
  return;
}

Assistant:

void target_release(void)
{
	target_fixed = false;

	/* If the old target is a now-dead monster, cancel it */
	if (old_target.midx != 0) {
		struct monster *mon = cave_monster(cave, old_target.midx);
		if (!mon || !mon->race || !monster_is_in_view(mon)) {
			target.grid.y = 0;
			target.grid.x = 0;
		}
	}
}